

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O3

void image_browse_cb(Fl_Button *b,void *v)

{
  int iVar1;
  Fluid_Image *pFVar2;
  Fl_Widget_Type *this;
  bool bVar3;
  
  if ((char *)v == "LOAD") {
    iVar1 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x17])();
    if ((iVar1 != 0) &&
       (iVar1 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x21])(), iVar1 == 0)) {
      Fl_Widget::activate(&b->super_Fl_Widget);
      return;
    }
    Fl_Widget::deactivate(&b->super_Fl_Widget);
    return;
  }
  pFVar2 = ui_find_image((image_input->super_Fl_Input_).value_);
  if ((pFVar2 != (Fluid_Image *)0x0) &&
     (Fl_Input_::value(&image_input->super_Fl_Input_,ui_find_image_name),
     Fl_Type::first != (Fl_Type *)0x0)) {
    bVar3 = true;
    this = (Fl_Widget_Type *)Fl_Type::first;
    do {
      while (((this->super_Fl_Type).selected != '\0' &&
             (iVar1 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x17])(this), iVar1 != 0))) {
        Fl_Widget_Type::image_name(this,ui_find_image_name);
        this = (Fl_Widget_Type *)(this->super_Fl_Type).next;
        bVar3 = false;
        if (this == (Fl_Widget_Type *)0x0) goto LAB_001834e5;
      }
      this = (Fl_Widget_Type *)(this->super_Fl_Type).next;
    } while (this != (Fl_Widget_Type *)0x0);
    if (!bVar3) {
LAB_001834e5:
      set_modflag(1);
      return;
    }
  }
  return;
}

Assistant:

void image_browse_cb(Fl_Button* b, void *v) {
  if (v == LOAD) {
    if (current_widget->is_widget() && !current_widget->is_window())
      b->activate();
    else 
      b->deactivate();
  } else {
    int mod = 0;
    if (ui_find_image(image_input->value())) {
      image_input->value(ui_find_image_name);
      for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
	if (o->selected && o->is_widget()) {
	  ((Fl_Widget_Type*)o)->image_name(ui_find_image_name);
	  mod = 1;
	}
      }
      if (mod) set_modflag(1);
    }
  }
}